

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O0

void __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setup(SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *lp)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long in_RSI;
  long in_RDI;
  int i_1;
  int i;
  int in_stack_ffffffffffffffcc;
  DataArray<int> *this_00;
  undefined4 local_18;
  undefined4 local_14;
  
  *(long *)(in_RDI + 0x10) = in_RSI + 0x178;
  *(long *)(in_RDI + 0x18) = in_RSI + 0xb0;
  this_00 = *(DataArray<int> **)(in_RDI + 0x10);
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x74b132);
  DataArray<int>::reSize(this_00,in_stack_ffffffffffffffcc);
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x74b156);
  DataArray<int>::reSize(this_00,in_stack_ffffffffffffffcc);
  local_14 = 0;
  while( true ) {
    iVar2 = local_14;
    iVar1 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x74b17c);
    if (iVar1 <= iVar2) break;
    piVar3 = DataArray<int>::operator[](*(DataArray<int> **)(in_RDI + 0x10),local_14);
    *piVar3 = 0;
    local_14 = local_14 + 1;
  }
  local_18 = 0;
  while( true ) {
    iVar2 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x74b1c4);
    if (iVar2 <= local_18) break;
    piVar3 = DataArray<int>::operator[](*(DataArray<int> **)(in_RDI + 0x18),local_18);
    *piVar3 = 0;
    local_18 = local_18 + 1;
  }
  *(long *)(in_RSI + 0x218) = in_RDI;
  return;
}

Assistant:

void SPxScaler<R>::setup(SPxLPBase<R>& lp)
{
   assert(lp.isConsistent());
   m_activeColscaleExp = &lp.LPColSetBase<R>::scaleExp;
   m_activeRowscaleExp = &lp.LPRowSetBase<R>::scaleExp;
   m_activeColscaleExp->reSize(lp.nCols());
   m_activeRowscaleExp->reSize(lp.nRows());

   for(int i = 0; i < lp.nCols(); ++i)
      (*m_activeColscaleExp)[i] = 0;

   for(int i = 0; i < lp.nRows(); ++i)
      (*m_activeRowscaleExp)[i] = 0;

   lp.lp_scaler = this;
}